

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_rolemaskproxymodel.cpp
# Opt level: O0

void __thiscall tst_RoleMaskProxyModel::testSort(tst_RoleMaskProxyModel *this)

{
  Orientation OVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  ModelTest *this_00;
  QVariant local_1700;
  QModelIndex local_16e0;
  QModelIndex local_16c8;
  QVariant local_16b0;
  QModelIndex local_1690;
  QModelIndex local_1678;
  QVariant local_1660;
  int local_163c;
  int currentData_1;
  QModelIndex local_1620;
  QVariant local_1608;
  QString local_15e8;
  QModelIndex local_15d0;
  QModelIndex local_15b8;
  QVariant local_15a0;
  QString local_1580;
  uint local_1564;
  undefined1 local_1560 [4];
  int i_2;
  QModelIndex local_1540;
  QVariant local_1528;
  QVariant local_1508;
  QModelIndex local_14e8;
  QModelIndex local_14d0;
  QVariant local_14b8;
  QString local_1498;
  int local_1480;
  Orientation local_147c;
  int currentData;
  int i_1;
  RoleMaskProxyModel proxyModel;
  QStringListModel local_1460 [8];
  QStringListModel baseModel;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_1438;
  iterator local_b0;
  iterator local_a8;
  QLatin1Char local_9b;
  QChar local_9a;
  QArrayDataPointer<char16_t> local_98;
  QString local_80;
  QString local_68;
  int local_50;
  int i;
  undefined1 local_40 [8];
  QStringList sequence;
  tst_RoleMaskProxyModel *this_local;
  char16_t *str;
  
  sequence.d.size = (qsizetype)this;
  QList<QString>::QList((QList<QString> *)local_40);
  QList<QString>::reserve((QList<QString> *)local_40,100);
  for (local_50 = 0; local_50 < 100; local_50 = local_50 + 1) {
    QArrayDataPointer<char16_t>::QArrayDataPointer(&local_98,(Data *)0x0,L"%1",2);
    QString::QString(&local_80,&local_98);
    iVar3 = local_50;
    QLatin1Char::QLatin1Char(&local_9b,'0');
    QChar::QChar(&local_9a,local_9b);
    QString::arg(&local_68,&local_80,iVar3,3,10,local_9a);
    QList<QString>::append((QList<QString> *)local_40,&local_68);
    QString::~QString(&local_68);
    QString::~QString(&local_80);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
  }
  local_a8 = QList<QString>::begin((QList<QString> *)local_40);
  local_b0 = QList<QString>::end((QList<QString> *)local_40);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(&local_1438,0x58);
  std::
  shuffle<QList<QString>::iterator,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
            (local_a8,local_b0,&local_1438);
  QStringListModel::QStringListModel(local_1460,(QList_conflict1 *)local_40,(QObject *)0x0);
  RoleMaskProxyModel::RoleMaskProxyModel((RoleMaskProxyModel *)&currentData,(QObject *)0x0);
  this_00 = (ModelTest *)operator_new(0x10);
  ModelTest::ModelTest(this_00,(QAbstractItemModel *)&currentData,&this->super_QObject);
  RoleMaskProxyModel::setSourceModel((QAbstractItemModel *)&currentData);
  RoleMaskProxyModel::addMaskedRole((int)&currentData);
  RoleMaskProxyModel::setTransparentIfEmpty(SUB81(&currentData,0));
  RoleMaskProxyModel::setMaskHeaderData(SUB81(&currentData,0));
  for (local_147c = 0; OVar1 = local_147c, (int)local_147c < 100;
      local_147c = local_147c + Horizontal) {
    QModelIndex::QModelIndex(&local_14e8);
    QIdentityProxyModel::index((int)&local_14d0,(int)&currentData,(QModelIndex *)(ulong)OVar1);
    QModelIndex::data(&local_14b8,&local_14d0,0);
    QVariant::toString();
    iVar3 = QString::toInt(&local_1498,(bool *)0x0,10);
    QString::~QString(&local_1498);
    QVariant::~QVariant(&local_14b8);
    OVar1 = local_147c;
    local_1480 = iVar3;
    QVariant::QVariant(&local_1508,iVar3);
    bVar2 = RoleMaskProxyModel::setHeaderData
                      ((int)&currentData,OVar1,(QVariant *)0x2,(int)&local_1508);
    bVar2 = QTest::qVerify((bool)(bVar2 & 1),
                           "proxyModel.setHeaderData(i, Qt::Vertical, currentData, Qt::UserRole)",""
                           ,
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                           ,0x501);
    QVariant::~QVariant(&local_1508);
    OVar1 = local_147c;
    if (((bVar2 ^ 0xff) & 1) != 0) {
      local_1528.d._28_4_ = 1;
      goto LAB_00126113;
    }
    QModelIndex::QModelIndex(&local_1540);
    QIdentityProxyModel::index((int)&local_1528,(int)&currentData,(QModelIndex *)(ulong)OVar1);
    QVariant::QVariant((QVariant *)local_1560,local_1480);
    bVar2 = RoleMaskProxyModel::setData((QModelIndex *)&currentData,&local_1528,(int)local_1560);
    bVar2 = QTest::qVerify((bool)(bVar2 & 1),
                           "proxyModel.setData(proxyModel.index(i, 0), currentData, Qt::UserRole)",
                           "",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                           ,0x502);
    QVariant::~QVariant((QVariant *)local_1560);
    if (((bVar2 ^ 0xff) & 1) != 0) {
      local_1528.d._28_4_ = 1;
      goto LAB_00126113;
    }
  }
  QStringListModel::sort((int)local_1460,AscendingOrder);
  local_1564 = 1;
  do {
    uVar4 = local_1564;
    if (99 < (int)local_1564) {
      local_1528.d._28_4_ = 0;
LAB_00126113:
      RoleMaskProxyModel::~RoleMaskProxyModel((RoleMaskProxyModel *)&currentData);
      QStringListModel::~QStringListModel(local_1460);
      QList<QString>::~QList((QList<QString> *)local_40);
      return;
    }
    QModelIndex::QModelIndex(&local_15d0);
    QIdentityProxyModel::index((int)&local_15b8,(int)&currentData,(QModelIndex *)(ulong)uVar4);
    QModelIndex::data(&local_15a0,&local_15b8,0);
    QVariant::toString();
    iVar3 = QString::toInt(&local_1580,(bool *)0x0,10);
    uVar4 = local_1564 - 1;
    QModelIndex::QModelIndex((QModelIndex *)&stack0xffffffffffffe9c8);
    QIdentityProxyModel::index((int)&local_1620,(int)&currentData,(QModelIndex *)(ulong)uVar4);
    QModelIndex::data(&local_1608,&local_1620,0);
    QVariant::toString();
    iVar5 = QString::toInt(&local_15e8,(bool *)0x0,10);
    bVar2 = QTest::qCompare(iVar3,iVar5 + 1,"proxyModel.index(i, 0).data().toString().toInt()",
                            "proxyModel.index(i - 1, 0).data().toString().toInt() + 1",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                            ,0x506);
    QString::~QString(&local_15e8);
    QVariant::~QVariant(&local_1608);
    QString::~QString(&local_1580);
    QVariant::~QVariant(&local_15a0);
    if (((bVar2 ^ 0xff) & 1) != 0) {
      local_1528.d._28_4_ = 1;
      goto LAB_00126113;
    }
    uVar4 = local_1564 - 1;
    QModelIndex::QModelIndex(&local_1690);
    QIdentityProxyModel::index((int)&local_1678,(int)&currentData,(QModelIndex *)(ulong)uVar4);
    QModelIndex::data(&local_1660,&local_1678,0x100);
    iVar3 = QVariant::toInt((bool *)&local_1660);
    QVariant::~QVariant(&local_1660);
    uVar4 = local_1564;
    local_163c = iVar3 + 1;
    QModelIndex::QModelIndex(&local_16e0);
    QIdentityProxyModel::index((int)&local_16c8,(int)&currentData,(QModelIndex *)(ulong)uVar4);
    QModelIndex::data(&local_16b0,&local_16c8,0x100);
    iVar3 = QVariant::toInt((bool *)&local_16b0);
    bVar2 = QTest::qCompare(iVar3,local_163c,"proxyModel.index(i, 0).data(Qt::UserRole).toInt()",
                            "currentData",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                            ,0x508);
    QVariant::~QVariant(&local_16b0);
    if (((bVar2 ^ 0xff) & 1) != 0) {
      local_1528.d._28_4_ = 1;
      goto LAB_00126113;
    }
    RoleMaskProxyModel::headerData((int)&local_1700,(Orientation)&currentData,local_1564);
    iVar3 = QVariant::toInt((bool *)&local_1700);
    bVar2 = QTest::qCompare(iVar3,local_163c,
                            "proxyModel.headerData(i, Qt::Vertical, Qt::UserRole).toInt()",
                            "currentData",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                            ,0x509);
    QVariant::~QVariant(&local_1700);
    if (((bVar2 ^ 0xff) & 1) != 0) {
      local_1528.d._28_4_ = 1;
      goto LAB_00126113;
    }
    local_1564 = local_1564 + 1;
  } while( true );
}

Assistant:

void tst_RoleMaskProxyModel::testSort()
{
    QStringList sequence;
    sequence.reserve(100);
    for (int i = 0; i < 100; ++i)
        sequence.append(QStringLiteral("%1").arg(i, 3, 10, QLatin1Char('0')));
    std::shuffle(sequence.begin(), sequence.end(), std::mt19937(88));
    QStringListModel baseModel(sequence);
    RoleMaskProxyModel proxyModel;
    new ModelTest(&proxyModel, this);
    proxyModel.setSourceModel(&baseModel);
    proxyModel.addMaskedRole(Qt::UserRole);
    proxyModel.setTransparentIfEmpty(true);
    proxyModel.setMaskHeaderData(true);
    for (int i = 0; i < 100; ++i) {
        const int currentData = proxyModel.index(i, 0).data().toString().toInt();
        QVERIFY(proxyModel.setHeaderData(i, Qt::Vertical, currentData, Qt::UserRole));
        QVERIFY(proxyModel.setData(proxyModel.index(i, 0), currentData, Qt::UserRole));
    }
    baseModel.sort(0, Qt::AscendingOrder);
    for (int i = 1; i < 100; ++i) {
        QCOMPARE(proxyModel.index(i, 0).data().toString().toInt(), proxyModel.index(i - 1, 0).data().toString().toInt() + 1);
        const int currentData = proxyModel.index(i - 1, 0).data(Qt::UserRole).toInt() + 1;
        QCOMPARE(proxyModel.index(i, 0).data(Qt::UserRole).toInt(), currentData);
        QCOMPARE(proxyModel.headerData(i, Qt::Vertical, Qt::UserRole).toInt(), currentData);
    }
}